

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall DPolyobjInterpolation::Serialize(DPolyobjInterpolation *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar1 = Serialize<FPolyObj>(arc,"poly",&this->poly,(FPolyObj **)0x0);
  pFVar1 = Serialize<double,double>(pFVar1,"oldverts",&this->oldverts,(TArray<double,_double> *)0x0)
  ;
  pFVar1 = ::Serialize(pFVar1,"oldcx",&this->oldcx,(double *)0x0);
  ::Serialize(pFVar1,"oldcy",&this->oldcy,(double *)0x0);
  if (arc->r != (FReader *)0x0) {
    TArray<double,_double>::Resize(&this->bakverts,(this->oldverts).Count);
    return;
  }
  return;
}

Assistant:

void DPolyobjInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("poly", poly)
		("oldverts", oldverts)
		("oldcx", oldcx)
		("oldcy", oldcy);
	if (arc.isReading()) bakverts.Resize(oldverts.Size());
}